

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time_impl.h
# Opt level: O2

uchar mbedtls_ct_uchar_in_range_if(uchar low,uchar high,uchar c,uchar t)

{
  undefined7 in_register_00000031;
  undefined3 in_register_00000039;
  
  return ~((byte)((uint)c - CONCAT31(in_register_00000039,low) >> 8) |
          (byte)((int)CONCAT71(in_register_00000031,high) - (uint)c >> 8)) & t;
}

Assistant:

static inline unsigned char mbedtls_ct_uchar_in_range_if(unsigned char low,
                                                         unsigned char high,
                                                         unsigned char c,
                                                         unsigned char t)
{
    const unsigned char co = (unsigned char) mbedtls_ct_compiler_opaque(c);
    const unsigned char to = (unsigned char) mbedtls_ct_compiler_opaque(t);

    /* low_mask is: 0 if low <= c, 0x...ff if low > c */
    unsigned low_mask = ((unsigned) co - low) >> 8;
    /* high_mask is: 0 if c <= high, 0x...ff if c > high */
    unsigned high_mask = ((unsigned) high - co) >> 8;

    return (unsigned char) (~(low_mask | high_mask)) & to;
}